

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

ostream * doctest::operator<<(ostream *stream,String *in)

{
  std::operator<<(stream,in->m_str);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const String& in) {
    stream << in.c_str();
    return stream;
}